

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::DisplayGraph(cmComputeTargetDepends *this,Graph *graph,string *name)

{
  uint uVar1;
  pointer pcVar2;
  FILE *pFVar3;
  ulong uVar4;
  string *psVar5;
  char *pcVar6;
  pointer pcVar7;
  ulong uVar8;
  
  fprintf(_stderr,"The %s target dependency graph is:\n",(name->_M_dataplus)._M_p);
  uVar4 = ((long)(graph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                 super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(graph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x18;
  uVar8 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    uVar8 = 0;
  }
  for (uVar4 = 0; pFVar3 = _stderr, uVar4 != uVar8; uVar4 = uVar4 + 1) {
    pcVar2 = (graph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
             super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->Targets).
                        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar4]);
    fprintf(pFVar3,"target %d is [%s]\n",uVar4 & 0xffffffff,(psVar5->_M_dataplus)._M_p);
    for (pcVar7 = *(pointer *)
                   &pcVar2[uVar4].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                    super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>; pFVar3 = _stderr,
        pcVar7 != *(pointer *)
                   ((long)&pcVar2[uVar4].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                           super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
        pcVar7 = pcVar7 + 1) {
      uVar1 = pcVar7->Dest;
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((this->Targets).
                          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[(int)uVar1]);
      pcVar6 = "weak";
      if (pcVar7->Strong != false) {
        pcVar6 = "strong";
      }
      fprintf(pFVar3,"  depends on target %d [%s] (%s)\n",(ulong)uVar1,(psVar5->_M_dataplus)._M_p,
              pcVar6);
    }
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void
cmComputeTargetDepends::DisplayGraph(Graph const& graph,
                                     const std::string& name)
{
  fprintf(stderr, "The %s target dependency graph is:\n", name.c_str());
  int n = static_cast<int>(graph.size());
  for(int depender_index = 0; depender_index < n; ++depender_index)
    {
    EdgeList const& nl = graph[depender_index];
    cmGeneratorTarget const* depender = this->Targets[depender_index];
    fprintf(stderr, "target %d is [%s]\n",
            depender_index, depender->GetName().c_str());
    for(EdgeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni)
      {
      int dependee_index = *ni;
      cmGeneratorTarget const* dependee = this->Targets[dependee_index];
      fprintf(stderr, "  depends on target %d [%s] (%s)\n", dependee_index,
              dependee->GetName().c_str(), ni->IsStrong()? "strong" : "weak");
      }
    }
  fprintf(stderr, "\n");
}